

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree.cpp
# Opt level: O0

void __thiscall
ParseNodeParamPattern::ParseNodeParamPattern
          (ParseNodeParamPattern *this,OpCode nop,charcount_t ichMin,charcount_t ichLim)

{
  charcount_t ichLim_local;
  charcount_t ichMin_local;
  OpCode nop_local;
  ParseNodeParamPattern *this_local;
  
  ParseNodeUni::ParseNodeUni(&this->super_ParseNodeUni,nop,ichMin,ichLim,(ParseNode *)0x0);
  return;
}

Assistant:

ParseNodeParamPattern::ParseNodeParamPattern(OpCode nop, charcount_t ichMin, charcount_t ichLim)
    : ParseNodeUni(nop, ichMin, ichLim, nullptr)
{
}